

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O3

Nwk_Grf_t * Nwk_ManGraphAlloc(int nVertsMax)

{
  uint uVar1;
  Nwk_Grf_t *pNVar2;
  Nwk_Edg_t **ppNVar3;
  Aig_MmFixed_t *pAVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  uint nEntriesMax;
  
  pNVar2 = (Nwk_Grf_t *)calloc(1,0xe0);
  pNVar2->nVertsMax = nVertsMax;
  uVar8 = nVertsMax * 3 - 1;
  while( true ) {
    do {
      nEntriesMax = uVar8 + 1;
      uVar1 = uVar8 & 1;
      uVar8 = nEntriesMax;
    } while (uVar1 != 0);
    if (nEntriesMax < 9) break;
    iVar7 = 5;
    while (nEntriesMax % (iVar7 - 2U) != 0) {
      uVar1 = iVar7 * iVar7;
      iVar7 = iVar7 + 2;
      if (nEntriesMax < uVar1) goto LAB_004ee8fb;
    }
  }
LAB_004ee8fb:
  pNVar2->nEdgeHash = nEntriesMax;
  ppNVar3 = (Nwk_Edg_t **)calloc((long)(int)nEntriesMax,8);
  pNVar2->pEdgeHash = ppNVar3;
  pAVar4 = Aig_MmFixedStart(0x10,nEntriesMax);
  pNVar2->pMemEdges = pAVar4;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  pNVar2->vPairs = pVVar5;
  return pNVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the graph.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nwk_Grf_t * Nwk_ManGraphAlloc( int nVertsMax )
{
    Nwk_Grf_t * p;
    p = ABC_ALLOC( Nwk_Grf_t, 1 );
    memset( p, 0, sizeof(Nwk_Grf_t) );
    p->nVertsMax = nVertsMax;
    p->nEdgeHash = Abc_PrimeCudd( 3 * nVertsMax );
    p->pEdgeHash = ABC_CALLOC( Nwk_Edg_t *, p->nEdgeHash );
    p->pMemEdges = Aig_MmFixedStart( sizeof(Nwk_Edg_t), p->nEdgeHash );
    p->vPairs    = Vec_IntAlloc( 1000 );
    return p;
}